

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::enclose_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  char *in_R8;
  ulong uVar4;
  uint uVar5;
  undefined1 local_a;
  spirv_cross local_9;
  
  pbVar1 = (byte *)(expr->_M_dataplus)._M_p;
  pcVar2 = (char *)expr->_M_string_length;
  if (pcVar2 != (char *)0x0) {
    uVar4 = (ulong)*pbVar1;
    if (((uVar4 < 0x2e) && ((0x2c4200000000U >> (uVar4 & 0x3f) & 1) != 0)) || (*pbVar1 == 0x7e)) {
LAB_001bb284:
      local_9 = (spirv_cross)0x28;
      local_a = 0x29;
      join<char,std::__cxx11::string_const&,char>
                (__return_storage_ptr__,&local_9,(char *)expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a,in_R8
                );
      return __return_storage_ptr__;
    }
    iVar3 = 0;
    in_R8 = (char *)0x1;
    do {
      uVar5 = (uint)uVar4;
      if (uVar5 < 0x5b) {
        if (uVar5 == 0x28) {
LAB_001bb2f5:
          iVar3 = iVar3 + 1;
        }
        else {
          if (uVar5 == 0x29) goto LAB_001bb2f9;
LAB_001bb301:
          if ((char)uVar4 == ' ' && iVar3 == 0) goto LAB_001bb284;
        }
      }
      else {
        if (uVar5 != 0x5d) {
          if (uVar5 != 0x5b) goto LAB_001bb301;
          goto LAB_001bb2f5;
        }
LAB_001bb2f9:
        if (iVar3 == 0) {
          __assert_fail("paren_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0xf29,
                        "string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
        }
        iVar3 = iVar3 + -1;
      }
      if (pcVar2 == in_R8) goto LAB_001bb326;
      uVar4 = (ulong)pbVar1[(long)in_R8];
      in_R8 = in_R8 + 1;
    } while( true );
  }
code_r0x001bb2c5:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pbVar1,pbVar1 + (long)pcVar2);
  return __return_storage_ptr__;
LAB_001bb326:
  if (iVar3 != 0) {
    __assert_fail("paren_count == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0xf32,"string spirv_cross::CompilerGLSL::enclose_expression(const string &)");
  }
  goto code_r0x001bb2c5;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (need_parens)
		return join('(', expr, ')');
	else
		return expr;
}